

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.h
# Opt level: O3

bool __thiscall pgn::find_move<(Piece)5>(pgn *this,position *p,Square *to,Move *m,int row,int col)

{
  byte bVar1;
  U8 UVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  U8 UVar8;
  U8 *pUVar9;
  Move *m_00;
  Movegen mvs;
  Movegen local_3a8;
  
  Movegen::Movegen(&local_3a8,p);
  uVar5 = (&bitboards::kmask)[*local_3a8.kings];
  uVar7 = local_3a8.enemies & uVar5;
  UVar2 = (U8)*local_3a8.kings;
  if (uVar7 != 0) {
    pUVar9 = &local_3a8.list[local_3a8.last].type;
    do {
      lVar6 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      ((Move *)(pUVar9 + -2))->f = UVar2;
      pUVar9[-1] = (U8)lVar6;
      *pUVar9 = '\v';
      pUVar9 = pUVar9 + 3;
      local_3a8.last = local_3a8.last + 1;
      uVar7 = uVar7 & uVar7 - 1;
    } while (uVar7 != 0);
  }
  uVar5 = uVar5 & local_3a8.empty;
  if (uVar5 != 0) {
    pUVar9 = &local_3a8.list[local_3a8.last].type;
    do {
      lVar6 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      ((Move *)(pUVar9 + -2))->f = UVar2;
      pUVar9[-1] = (U8)lVar6;
      *pUVar9 = '\n';
      pUVar9 = pUVar9 + 3;
      local_3a8.last = local_3a8.last + 1;
      uVar5 = uVar5 & uVar5 - 1;
    } while (uVar5 != 0);
  }
  if (local_3a8.can_castle_ks == true) {
    lVar6 = (long)local_3a8.last;
    local_3a8.last = local_3a8.last + 1;
    UVar8 = '>';
    if (local_3a8.us == white) {
      UVar8 = '\x06';
    }
    local_3a8.list[lVar6].f = UVar2;
    local_3a8.list[lVar6].t = UVar8;
    local_3a8.list[lVar6].type = '\b';
  }
  if (local_3a8.can_castle_qs == true) {
    lVar6 = (long)local_3a8.last;
    local_3a8.last = local_3a8.last + 1;
    UVar8 = ':';
    if (local_3a8.us == white) {
      UVar8 = '\x02';
    }
    local_3a8.list[lVar6].f = UVar2;
    local_3a8.list[lVar6].t = UVar8;
    local_3a8.list[lVar6].type = '\t';
  }
  if (0 < local_3a8.last) {
    UVar2 = m->type;
    m_00 = local_3a8.list;
    lVar6 = 0;
    do {
      bVar3 = position::is_legal(p,m_00);
      if (bVar3) {
        if (UVar2 == '\x11') {
          bVar1 = m_00->t;
          if (*to == (uint)bVar1) {
            if (((row < 0) || (bVar4 = m_00->f, (uint)(bVar4 >> 3) != row)) &&
               ((col < 0 || (bVar4 = m_00->f, (bVar4 & 7) != col)))) {
              if (-1 < (col & row)) goto LAB_0011dc8c;
              m->f = m_00->f;
            }
            else {
              m->f = bVar4;
            }
            m->t = bVar1;
            m->type = m_00->type;
LAB_0011dcf8:
            bVar3 = true;
            goto LAB_0011dca3;
          }
        }
        else if ((m->type == m_00->type) && (bVar1 = m_00->t, *to == (uint)bVar1)) {
          if (((row < 0) || (bVar4 = m_00->f, (uint)(bVar4 >> 3) != row)) &&
             ((col < 0 || (bVar4 = m_00->f, (bVar4 & 7) != col)))) {
            if (-1 < (col & row)) goto LAB_0011dc8c;
            m->f = m_00->f;
          }
          else {
            m->f = bVar4;
          }
          m->t = bVar1;
          goto LAB_0011dcf8;
        }
      }
LAB_0011dc8c:
      lVar6 = lVar6 + 1;
      m_00 = m_00 + 1;
    } while (lVar6 < local_3a8.last);
  }
  bVar3 = false;
LAB_0011dca3:
  Movegen::~Movegen(&local_3a8);
  return bVar3;
}

Assistant:

bool pgn::find_move(position& p, const Square& to, Move& m, int row, int col) {

	Movegen mvs(p);
	mvs.generate<piece>();
	bool promotion = (m.type != Movetype::no_type);


	for (int j = 0; j < mvs.size(); ++j) {

		if (!p.is_legal(mvs[j])) continue;

		if (promotion && m.type == mvs[j].type && mvs[j].t == to) {

			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

		else if (!promotion && mvs[j].t == to) {
			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

	}
	return false;
}